

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frontend_tester.cpp
# Opt level: O1

FailStep failStepFromString(string *str)

{
  int iVar1;
  FailStep FVar2;
  runtime_error *this;
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  if (iVar1 == 0) {
    FVar2 = None;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)str);
    if (iVar1 == 0) {
      FVar2 = Parsing;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)str);
      FVar2 = SemanticAnalysis;
      if (iVar1 != 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Unknown fail step provided");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return FVar2;
}

Assistant:

FailStep failStepFromString(const std::string & str) {
  if (str == "none") {
    return FailStep::None;
  }

  if (str == "parsing") {
    return FailStep::Parsing;
  }

  if (str == "semantic_analysis") {
    return FailStep::SemanticAnalysis;
  }

  throw std::runtime_error("Unknown fail step provided");
}